

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O1

bool __thiscall
cmCreateTestSourceList::InitialPass
          (cmCreateTestSourceList *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  int iVar3;
  string *psVar4;
  undefined8 *puVar5;
  cmSourceFile *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong *puVar8;
  size_type sVar9;
  string *psVar10;
  undefined1 uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  undefined8 uVar14;
  pointer pbVar15;
  pointer pbVar16;
  string *__return_storage_ptr__;
  string sourceListValue;
  string driver;
  string functionMapCode;
  string extraInclude;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  string configFile;
  string function;
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  cmCommand *local_1a8;
  string local_1a0;
  string local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  string local_158;
  string local_138;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  cmNewLineStyle local_dc;
  string local_d8;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_38;
  
  pbVar16 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16) < 0x41) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"called with wrong number of arguments.","");
    cmCommand::SetError(local_1a8,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    uVar11 = 0;
  }
  else {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88 = '\0';
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_160 = args;
    if (pbVar16 !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar3 = std::__cxx11::string::compare((char *)pbVar16);
        if (iVar3 == 0) {
          pbVar15 = pbVar16 + 1;
          if (pbVar15 ==
              (local_160->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"incorrect arguments to EXTRA_INCLUDE","");
            cmCommand::SetError(local_1a8,&local_1a0);
            goto LAB_0022a192;
          }
          std::__cxx11::string::_M_replace
                    ((ulong)&local_118,0,(char *)local_118._M_string_length,0x4a38a1);
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)pbVar16[1]._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_118);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)pbVar16);
          if (iVar3 == 0) {
            pbVar15 = pbVar16 + 1;
            if (pbVar15 ==
                (local_160->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a0,"incorrect arguments to FUNCTION","");
              cmCommand::SetError(local_1a8,&local_1a0);
              goto LAB_0022a192;
            }
            std::__cxx11::string::_M_assign((string *)&local_98);
            std::__cxx11::string::append((char *)&local_98);
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_f8,pbVar16);
            pbVar15 = pbVar16;
          }
        }
        pbVar16 = pbVar15 + 1;
      } while (pbVar16 !=
               (local_160->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar16 = local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__ =
         (string *)
         ((local_f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&local_1a0,
               local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    paVar7 = &local_1a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar7) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    local_1a0._M_dataplus._M_p = (pointer)paVar7;
    if (local_1a0._M_string_length < 2) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"You must specify a file extension for the test driver file.",
                 "");
      cmCommand::SetError(local_1a8,&local_1a0);
LAB_0022a192:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      uVar11 = 0;
    }
    else {
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_1a8->Makefile);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,pcVar1,pcVar1 + psVar4->_M_string_length);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)pbVar16[1]._M_dataplus._M_p);
      psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + psVar4->_M_string_length);
      local_38 = __return_storage_ptr__;
      std::__cxx11::string::append((char *)&local_b8);
      psVar4 = pbVar16 + 2;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
      if (psVar4 != local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        psVar10 = psVar4;
        do {
          iVar3 = std::__cxx11::string::compare((char *)psVar10);
          if (iVar3 == 0) break;
          local_180._M_string_length = 0;
          local_180.field_2._M_local_buf[0] = '\0';
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          cmsys::SystemTools::GetFilenamePath((string *)local_1e8,psVar10);
          uVar12 = local_1e8._8_8_;
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          if (uVar12 == 0) {
            __return_storage_ptr__ = (string *)local_1e8;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(__return_storage_ptr__,psVar10);
            std::__cxx11::string::operator=((string *)&local_180,(string *)__return_storage_ptr__);
            uVar12 = local_1e8._16_8_;
            _Var13._M_p = (pointer)local_1e8._0_8_;
            if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) goto LAB_00229916;
          }
          else {
            __return_storage_ptr__ = &local_158;
            cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,psVar10);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)__return_storage_ptr__);
            local_1c8._M_allocated_capacity = (size_type)&local_1b8;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 == paVar7) {
              local_1b8._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_1b8._8_8_ = puVar5[3];
            }
            else {
              local_1b8._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_1c8._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_1c8._8_8_ = puVar5[1];
            *puVar5 = paVar7;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,psVar10);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) {
              uVar12 = local_1b8._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_138._M_string_length + local_1c8._8_8_) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                uVar12 = local_138.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_138._M_string_length + local_1c8._8_8_) goto LAB_00229820;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_138,0,(char *)0x0,local_1c8._M_allocated_capacity);
            }
            else {
LAB_00229820:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 (local_1c8._M_local_buf,(ulong)local_138._M_dataplus._M_p);
            }
            local_1e8._0_8_ = local_1e8 + 0x10;
            puVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_1e8._16_8_ = *puVar8;
              local_1e8._24_8_ = puVar5[3];
            }
            else {
              local_1e8._16_8_ = *puVar8;
              local_1e8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_1e8._8_8_ = puVar5[1];
            *puVar5 = puVar8;
            puVar5[1] = 0;
            *(undefined1 *)puVar8 = 0;
            std::__cxx11::string::operator=((string *)&local_180,(string *)local_1e8);
            if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
              operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity,
                              local_1b8._M_allocated_capacity + 1);
            }
            uVar12 = local_158.field_2._M_allocated_capacity;
            _Var13._M_p = local_158._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_00229916:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_180);
          if (local_180._M_string_length != 0) {
            sVar9 = 0;
            do {
              if (local_180._M_dataplus._M_p[sVar9] == ' ') {
                local_180._M_dataplus._M_p[sVar9] = '_';
              }
              sVar9 = sVar9 + 1;
            } while (local_180._M_string_length != sVar9);
          }
          if (local_180._M_string_length != 0) {
            sVar9 = 0;
            do {
              if (local_180._M_dataplus._M_p[sVar9] == '/') {
                local_180._M_dataplus._M_p[sVar9] = '_';
              }
              sVar9 = sVar9 + 1;
            } while (local_180._M_string_length != sVar9);
          }
          if (local_180._M_string_length != 0) {
            sVar9 = 0;
            do {
              if (local_180._M_dataplus._M_p[sVar9] == ':') {
                local_180._M_dataplus._M_p[sVar9] = '_';
              }
              sVar9 = sVar9 + 1;
            } while (local_180._M_string_length != sVar9);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_58,&local_180);
          std::__cxx11::string::append((char *)&local_78);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_180._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,
                            CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                     local_180.field_2._M_local_buf[0]) + 1);
          }
          psVar10 = psVar10 + 1;
        } while (psVar10 !=
                 local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      if (psVar4 != local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        __return_storage_ptr__ = (string *)(local_1e8 + 0x10);
        psVar10 = psVar4;
        pbVar16 = local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_1e8._8_8_ = 0;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1e8._0_8_ = __return_storage_ptr__;
          cmsys::SystemTools::GetFilenamePath((string *)&local_1c8,psVar10);
          uVar12 = local_1c8._8_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_allocated_capacity != &local_1b8) {
            operator_delete((void *)local_1c8._M_allocated_capacity,
                            local_1b8._M_allocated_capacity + 1);
          }
          if (uVar12 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&local_1c8,psVar10);
            std::__cxx11::string::operator=((string *)local_1e8,(string *)local_1c8._M_local_buf);
            uVar12 = local_1b8._M_allocated_capacity;
            uVar14 = local_1c8._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) goto LAB_00229cb1;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_138,psVar10);
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            puVar8 = puVar5 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar8) {
              local_158.field_2._M_allocated_capacity = *puVar8;
              local_158.field_2._8_8_ = puVar5[3];
            }
            else {
              local_158.field_2._M_allocated_capacity = *puVar8;
              local_158._M_dataplus._M_p = (pointer)*puVar5;
            }
            local_158._M_string_length = puVar5[1];
            *puVar5 = puVar8;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_d8,psVar10);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              uVar12 = local_158.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_d8._M_string_length + local_158._M_string_length) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar12 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_d8._M_string_length + local_158._M_string_length)
              goto LAB_00229baf;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_d8,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
            }
            else {
LAB_00229baf:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_158,(ulong)local_d8._M_dataplus._M_p);
            }
            local_1c8._M_allocated_capacity = (size_type)&local_1b8;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5 == paVar7) {
              local_1b8._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_1b8._8_8_ = puVar5[3];
            }
            else {
              local_1b8._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_1c8._M_allocated_capacity =
                   (size_type)
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
            }
            local_1c8._8_8_ = puVar5[1];
            *puVar5 = paVar7;
            puVar5[1] = 0;
            paVar7->_M_local_buf[0] = '\0';
            std::__cxx11::string::operator=((string *)local_1e8,(string *)local_1c8._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_allocated_capacity != &local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity,
                              local_1b8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_138.field_2._M_allocated_capacity;
            uVar14 = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_00229cb1:
              operator_delete((void *)uVar14,uVar12 + 1);
            }
          }
          std::__cxx11::string::append((char *)&local_180);
          std::__cxx11::string::_M_append((char *)&local_180,local_1e8._0_8_);
          std::__cxx11::string::append((char *)&local_180);
          std::__cxx11::string::_M_append((char *)&local_180,(ulong)(pbVar16->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_180);
          if ((string *)local_1e8._0_8_ != __return_storage_ptr__) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          psVar10 = psVar10 + 1;
          pbVar16 = pbVar16 + 1;
        } while (psVar10 !=
                 local_f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((char *)local_118._M_string_length != (char *)0x0) {
        pcVar2 = local_1a8->Makefile;
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        cmMakefile::AddDefinition(pcVar2,(string *)local_1e8,local_118._M_dataplus._M_p);
        if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
      }
      if (local_90 != 0) {
        pcVar2 = local_1a8->Makefile;
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        cmMakefile::AddDefinition(pcVar2,(string *)local_1e8,local_98);
        if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
      }
      pcVar2 = local_1a8->Makefile;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1e8 + 0x10);
      local_1e8._0_8_ = paVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"CMAKE_FORWARD_DECLARE_TESTS","");
      cmMakefile::AddDefinition(pcVar2,(string *)local_1e8,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != paVar7) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      pcVar2 = local_1a8->Makefile;
      local_1e8._0_8_ = paVar7;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"CMAKE_FUNCTION_TABLE_ENTIRES","");
      cmMakefile::AddDefinition(pcVar2,(string *)local_1e8,local_180._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._0_8_ != paVar7) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      pcVar2 = local_1a8->Makefile;
      cmNewLineStyle::cmNewLineStyle(&local_dc);
      iVar3 = cmMakefile::ConfigureFile(pcVar2,&local_b8,&local_1a0,false,true,false,local_dc);
      local_1e8._8_8_ = 0;
      local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
      local_1e8._0_8_ = paVar7;
      pcVar6 = cmMakefile::GetOrCreateSource(local_1a8->Makefile,&local_1a0,false,Ambiguous);
      local_1c8._M_allocated_capacity = (size_type)&local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar6,(string *)&local_1c8,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
      std::__cxx11::string::_M_assign((string *)local_1e8);
      local_160 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(local_160._4_4_,
                              (int)CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),iVar3 != 0));
      if (psVar4 != local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar6 = cmMakefile::GetOrCreateSource(local_1a8->Makefile,psVar4,false,Ambiguous);
          local_1c8._M_allocated_capacity = (size_type)&local_1b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar6,(string *)&local_1c8,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_allocated_capacity != &local_1b8) {
            operator_delete((void *)local_1c8._M_allocated_capacity,
                            local_1b8._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_1e8);
          std::__cxx11::string::_M_append(local_1e8,(ulong)(psVar4->_M_dataplus)._M_p);
          psVar4 = psVar4 + 1;
        } while (psVar4 != local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar2 = local_1a8->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8._M_local_buf,(char *)local_38,(allocator<char> *)&local_158);
      cmMakefile::AddDefinition(pcVar2,(string *)&local_1c8,(char *)local_1e8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
      uVar11 = local_160._0_1_;
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,
                        CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                 local_180.field_2._M_local_buf[0]) + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
  }
  return (bool)uVar11;
}

Assistant:

bool cmCreateTestSourceList::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with wrong number of arguments.");
    return false;
  }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = "#include \"";
      extraInclude += *i;
      extraInclude += "\"\n";
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        this->SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = *i;
      function += "(&ac, &av);\n";
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    this->SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  std::string driver = this->Makefile->GetCurrentBinaryDirectory();
  driver += "/";
  driver += *i;
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  std::vector<std::string>::const_iterator testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    std::replace(func_name.begin(), func_name.end(), ' ', '_');
    std::replace(func_name.begin(), func_name.end(), '/', '_');
    std::replace(func_name.begin(), func_name.end(), ':', '_');
    tests_func_name.push_back(func_name);
    forwardDeclareCode += "int ";
    forwardDeclareCode += func_name;
    forwardDeclareCode += "(int, char*[]);\n";
  }

  std::string functionMapCode;
  int numTests = 0;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
    numTests++;
  }
  if (!extraInclude.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES",
                                  extraInclude.c_str());
  }
  if (!function.empty()) {
    this->Makefile->AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION",
                                  function.c_str());
  }
  this->Makefile->AddDefinition("CMAKE_FORWARD_DECLARE_TESTS",
                                forwardDeclareCode.c_str());
  this->Makefile->AddDefinition("CMAKE_FUNCTION_TABLE_ENTIRES",
                                functionMapCode.c_str());
  bool res = true;
  if (!this->Makefile->ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return res;
}